

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::
write_int<long_long,fmt::v5::basic_format_specs<char>>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>
           *this,longlong value,basic_format_specs<char> *spec)

{
  byte bVar1;
  int_writer<long_long,_fmt::v5::basic_format_specs<char>_> local_20;
  
  local_20.prefix_size = 0;
  if (value < 0) {
    local_20.prefix[0] = '-';
    local_20.prefix_size = 1;
    local_20.abs_value = -value;
  }
  else {
    bVar1 = (spec->super_core_format_specs).flags;
    local_20.abs_value = value;
    if ((bVar1 & 1) != 0) {
      local_20.prefix[0] = '+';
      if ((bVar1 & 2) == 0) {
        local_20.prefix[0] = ' ';
      }
      local_20.prefix_size = 1;
    }
  }
  local_20.writer =
       (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
        *)this;
  local_20.spec = spec;
  internal::
  handle_int_type_spec<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>>
            ((spec->super_core_format_specs).type,&local_20);
  return;
}

Assistant:

void write_int(T value, const Spec &spec) {
    internal::handle_int_type_spec(spec.type,
                                   int_writer<T, Spec>(*this, value, spec));
  }